

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS
ref_shard_add_pyr_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes,REF_BOOL check_volume)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  REF_DBL vol;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  REF_GLOB global [27];
  
  lVar2 = -1;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    iVar1 = nodes[lVar4];
    lVar6 = lVar2;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar6 = ref_node->global[iVar1], ref_node->global[iVar1] < 0)) {
      lVar6 = lVar2;
    }
    global[lVar4] = lVar6;
  }
  if ((global[0] < global[1] && global[0] < global[3]) ||
     (global[4] < global[3] && global[4] < global[1])) {
    local_178 = *nodes;
    uStack_174 = nodes[4];
    uStack_170 = (uint)*(undefined8 *)(nodes + 1);
    uStack_16c = (uint)((ulong)*(undefined8 *)(nodes + 1) >> 0x20);
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (uVar3 == 0) {
      if (check_volume != 0) {
        uVar3 = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,&vol);
        if (uVar3 != 0) {
          pcVar7 = "tet vol";
          uVar5 = 0x26f;
          goto LAB_0017ff02;
        }
        if (vol <= 0.0) {
          printf("tet vol %e\n");
          printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
                 (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
          printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)uStack_174,(ulong)uStack_170,
                 (ulong)uStack_16c);
        }
      }
      local_178 = *nodes;
      uStack_174 = (uint)*(undefined8 *)(nodes + 3);
      uStack_170 = (uint)((ulong)*(undefined8 *)(nodes + 3) >> 0x20);
      uStack_16c = nodes[2];
      uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
      if (uVar3 == 0) {
        if (check_volume == 0) {
          return 0;
        }
        uVar3 = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,&vol);
        if (uVar3 == 0) goto LAB_0017ff6e;
        uVar5 = 0x275;
        goto LAB_0017ff5f;
      }
      pcVar7 = "a tet";
      uVar5 = 0x274;
    }
    else {
      pcVar7 = "a tet";
      uVar5 = 0x26e;
    }
  }
  else {
    local_178 = *nodes;
    uStack_170 = nodes[1];
    uStack_16c = nodes[2];
    uStack_174 = nodes[3];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (uVar3 == 0) {
      if (check_volume != 0) {
        uVar3 = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,&vol);
        if (uVar3 != 0) {
          pcVar7 = "tet vol";
          uVar5 = 0x27f;
          goto LAB_0017ff02;
        }
        if (vol <= 0.0) {
          printf("tet vol %e\n");
          printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
                 (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
          printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)uStack_174,(ulong)uStack_170,
                 (ulong)uStack_16c);
        }
      }
      local_178 = nodes[1];
      uStack_16c = nodes[2];
      uStack_174 = nodes[3];
      uStack_170 = nodes[4];
      uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
      if (uVar3 == 0) {
        if (check_volume == 0) {
          return 0;
        }
        uVar3 = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,&vol);
        if (uVar3 == 0) {
LAB_0017ff6e:
          if (0.0 < vol) {
            return 0;
          }
          printf("tet vol %e\n");
          printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
                 (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
          printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)uStack_174,(ulong)uStack_170,
                 (ulong)uStack_16c);
          return 0;
        }
        uVar5 = 0x285;
LAB_0017ff5f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               uVar5,"ref_shard_add_pyr_as_tet",(ulong)uVar3,"tet vol");
        return uVar3;
      }
      pcVar7 = "a tet";
      uVar5 = 0x284;
    }
    else {
      pcVar7 = "a tet";
      uVar5 = 0x27e;
    }
  }
LAB_0017ff02:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar5,
         "ref_shard_add_pyr_as_tet",(ulong)uVar3,pcVar7);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_pyr_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes,
                                                   REF_BOOL check_volume) {
  REF_INT node;
  REF_GLOB global[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];
  for (node = 0; node < 5; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  if ((global[0] < global[1] && global[0] < global[3]) ||
      (global[4] < global[1] &&
       global[4] < global[3])) { /* 0-4 diag split of quad */
                                 /* 4-1\
                                    |\| 2
                                    3-0/ */
    tet_nodes[0] = nodes[0];
    tet_nodes[1] = nodes[4];
    tet_nodes[2] = nodes[1];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
    tet_nodes[0] = nodes[0];
    tet_nodes[1] = nodes[3];
    tet_nodes[2] = nodes[4];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
  } else { /* 3-1 diag split of quad */
           /* 4-1\
              |/| 2
              3-0/ */
    tet_nodes[0] = nodes[0];
    tet_nodes[1] = nodes[3];
    tet_nodes[2] = nodes[1];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
    tet_nodes[0] = nodes[1];
    tet_nodes[1] = nodes[3];
    tet_nodes[2] = nodes[4];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
  }
  return REF_SUCCESS;
}